

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskController.cpp
# Opt level: O2

void __thiscall Storage::Disk::Controller::Controller(Controller *this,Cycles clock_rate)

{
  Drive *this_00;
  long lVar1;
  
  (this->super_Source).observer_ = (Observer *)0x0;
  (this->super_Source)._vptr_Source = (_func_int **)&PTR_preferred_clocking_0058e010;
  (this->super_EventDelegate)._vptr_EventDelegate = (_func_int **)&PTR_process_event_0058e058;
  (this->super_Observer)._vptr_Observer = (_func_int **)&DAT_0058e080;
  (this->bit_length_).length = 0;
  (this->bit_length_).clock_rate = 1;
  lVar1 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(128000000)) /
                 SEXT816((long)clock_rate.super_WrappedInt<Cycles>.length_),0);
  this->clock_rate_multiplier_ = lVar1;
  this->clock_rate_ = lVar1 * (long)clock_rate.super_WrappedInt<Cycles>.length_;
  this->is_reading_ = true;
  DigitalPhaseLockedLoop<Storage::Disk::Controller,_3UL>::DigitalPhaseLockedLoop
            (&this->pll_,100,this);
  this_00 = &this->empty_drive_;
  Drive::Drive(this_00,(int)clock_rate.super_WrappedInt<Cycles>.length_,1,1,ShugartRDY);
  (this->drives_).
  super__Vector_base<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>,_std::allocator<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->drives_).
  super__Vector_base<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>,_std::allocator<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->drives_).
  super__Vector_base<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>,_std::allocator<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->drive_ = this_00;
  this->drive_selection_mask_ = 0xff;
  (this->empty_drive_).super_Source.observer_ = &this->super_Observer;
  ClockingHint::Source::update_clocking_observer(&this_00->super_Source);
  set_expected_bit_length(this,(Time)0x100000001);
  return;
}

Assistant:

Controller::Controller(Cycles clock_rate) :
		clock_rate_multiplier_(128000000 / clock_rate.as_integral()),
		clock_rate_(clock_rate.as_integral() * clock_rate_multiplier_),
		pll_(100, *this),
		empty_drive_(int(clock_rate.as_integral()), 1, 1),
		drive_(&empty_drive_) {
	empty_drive_.set_clocking_hint_observer(this);
	set_expected_bit_length(Time(1));
}